

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

shared_ptr<aeron::Publication> __thiscall
aeron::archive::AeronArchive::addRecordedPublication
          (AeronArchive *this,string *channel,int32_t streamId)

{
  long lVar1;
  AeronArchive *pAVar2;
  ArchiveException *this_00;
  char *pcVar3;
  int32_t in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<aeron::Publication> sVar4;
  allocator local_106;
  allocator local_105;
  int32_t local_104;
  AeronArchive *local_100;
  string *local_f8;
  undefined1 local_f0 [32];
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = (string *)CONCAT44(in_register_00000014,streamId);
  local_104 = in_ECX;
  ClientConductor::addPublication
            ((ClientConductor *)(channel[9]._M_string_length + 0x24b0),local_f8,in_ECX);
  (this->ctx_).cfg_.messageTimeoutNs = 0;
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)0x0;
  local_100 = this;
  while( true ) {
    ClientConductor::findPublication
              ((ClientConductor *)local_f0,channel[9]._M_string_length + 0x24b0);
    pAVar2 = local_100;
    std::__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
    lVar1 = (pAVar2->ctx_).cfg_.messageTimeoutNs;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
    if (lVar1 != 0) break;
    sched_yield();
  }
  lVar1 = (local_100->ctx_).cfg_.messageTimeoutNs;
  if (*(long *)(lVar1 + 0x40) == *(long *)(lVar1 + 0x38)) {
    ChannelUri::addSessionId((string *)local_f0,local_f8,*(int32_t *)(lVar1 + 0x54));
    startRecording((AeronArchive *)channel,(string *)local_f0,local_104,LOCAL);
    std::__cxx11::string::~string((string *)local_f0);
    sVar4.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_100;
    return (shared_ptr<aeron::Publication>)
           sVar4.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::operator+(&local_70,"publication already added for channel=",local_f8);
  std::operator+(&local_50,&local_70,", stream id=");
  std::__cxx11::to_string(&local_90,local_104);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 &local_50,&local_90);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "std::shared_ptr<aeron::Publication> aeron::archive::AeronArchive::addRecordedPublication(const std::string &, std::int32_t)"
             ,&local_105);
  pcVar3 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_d0,pcVar3,&local_106);
  ArchiveException::ArchiveException(this_00,(string *)local_f0,&local_b0,&local_d0,0x82);
  __cxa_throw(this_00,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::shared_ptr<aeron::Publication> AeronArchive::addRecordedPublication(const std::string& channel,
                                                                         std::int32_t streamId) {
    std::int64_t pubId = aeron_->addPublication(channel, streamId);
    std::shared_ptr<aeron::Publication> publication;
    while (!(publication = aeron_->findPublication(pubId))) {
        std::this_thread::yield();
    }

    if (!publication->isOriginal()) {
        throw ArchiveException(
            "publication already added for channel=" + channel + ", stream id=" + std::to_string(streamId), SOURCEINFO);
    }

    startRecording(ChannelUri::addSessionId(channel, publication->sessionId()), streamId,
                   codecs::SourceLocation::LOCAL);

    return publication;
}